

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  int32_t iVar5;
  uint uVar6;
  istream *piVar7;
  invalid_argument *piVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t j;
  ulong uVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  shared_ptr<fasttext::Matrix> sVar13;
  int64_t dim;
  int64_t n;
  DenseMatrix input;
  DenseMatrix mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  undefined1 local_2b8 [64];
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)in_RDX,_S_in);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,in_RDX,
                   " cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar8,(string *)&mat);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar7 = std::istream::_M_extract<long>((long *)&in);
  std::istream::_M_extract<long>((long *)piVar7);
  if (dim == *(int *)((filename->_M_dataplus)._M_p + 0x4c)) {
    DenseMatrix::DenseMatrix(&mat,n,dim);
    for (uVar12 = 0; uVar12 < (ulong)n; uVar12 = uVar12 + 1) {
      input.super_Matrix._vptr_Matrix = (_func_int **)&input.super_Matrix.n_;
      input.super_Matrix.m_ = 0;
      input.super_Matrix.n_._0_1_ = 0;
      std::operator>>((istream *)&in,(string *)&input);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&words,(value_type *)&input);
      Dictionary::add((Dictionary *)(filename->field_2)._M_allocated_capacity,(string *)&input);
      for (uVar9 = 0; uVar9 < (ulong)dim; uVar9 = uVar9 + 1) {
        std::istream::_M_extract<float>((float *)&in);
      }
      std::__cxx11::string::~string((string *)&input);
    }
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold((Dictionary *)(filename->field_2)._M_allocated_capacity,1,0);
    Dictionary::init((Dictionary *)(filename->field_2)._M_allocated_capacity,ctx);
    iVar5 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
    pcVar1 = (filename->_M_dataplus)._M_p;
    DenseMatrix::DenseMatrix
              (&input,(long)iVar5 + (long)*(int *)(pcVar1 + 0x70),(long)*(int *)(pcVar1 + 0x4c));
    DenseMatrix::uniform(&input,1.0 / (float)*(int *)((filename->_M_dataplus)._M_p + 0x4c));
    lVar11 = 0;
    for (uVar12 = 0; uVar12 < (ulong)n; uVar12 = uVar12 + 1) {
      uVar6 = Dictionary::getId((Dictionary *)(filename->field_2)._M_allocated_capacity,
                                words.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar12);
      if (-1 < (int)uVar6) {
        iVar5 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
        if ((int)uVar6 < iVar5) {
          for (lVar10 = 0; dim != lVar10; lVar10 = lVar10 + 1) {
            input.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)uVar6 * CONCAT71(input.super_Matrix.n_._1_7_,(undefined1)input.super_Matrix.n_)
             + lVar10] = *(float *)((long)mat.data_.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                   lVar10 * 4 + mat.super_Matrix.n_ * lVar11);
          }
        }
      }
      lVar11 = lVar11 + 4;
    }
    std::make_shared<fasttext::DenseMatrix,fasttext::DenseMatrix>((DenseMatrix *)local_2b8);
    uVar3 = local_2b8._8_8_;
    uVar2 = local_2b8._0_8_;
    local_2b8._8_8_ = 0;
    local_2b8._0_8_ = (_func_int **)0x0;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar2;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 8));
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&input.data_.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&mat.data_.super__Vector_base<float,_std::allocator<float>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&words);
    std::ifstream::~ifstream(&in);
    sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<fasttext::Matrix>)
           sVar13.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_278,dim);
  std::operator+(&local_258,"Dimension of pretrained vectors (",&local_278);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 &local_258,") does not match dimension (");
  std::__cxx11::to_string
            ((string *)(local_2b8 + 0x20),*(int *)((filename->_M_dataplus)._M_p + 0x4c));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_2b8 + 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,")!");
  std::invalid_argument::invalid_argument(piVar8,(string *)&mat);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  DenseMatrix mat(n, dim); // temp. matrix for pretrained vectors
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat.at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  DenseMatrix input(dict_->nwords() + args_->bucket, args_->dim);
  input.uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input.at(idx, j) = mat.at(i, j);
    }
  }
  return std::make_shared<DenseMatrix>(std::move(input));
}